

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void raviX_ptrlist_split_node(PtrList *head)

{
  undefined2 uVar1;
  C_MemoryAllocator *pCVar2;
  PtrList *pPVar3;
  int iVar4;
  int iVar5;
  PtrList *pPVar6;
  PtrList *next;
  PtrList *newlist;
  C_MemoryAllocator *alloc;
  int nr;
  int old;
  PtrList *head_local;
  
  uVar1 = *(undefined2 *)head;
  iVar4 = (int)(short)(char)uVar1 / 2;
  pCVar2 = head->allocator_;
  if (pCVar2 != (C_MemoryAllocator *)0x0) {
    pPVar6 = (PtrList *)(*pCVar2->calloc)(pCVar2->arena,1,0x58);
    pPVar3 = head->next_;
    pPVar6->allocator_ = pCVar2;
    iVar5 = (short)(char)uVar1 - iVar4;
    *(ushort *)head = *(ushort *)head & 0xff00 | (ushort)iVar5 & 0xff;
    pPVar6->next_ = pPVar3;
    pPVar3->prev_ = pPVar6;
    pPVar6->prev_ = head;
    head->next_ = pPVar6;
    *(ushort *)pPVar6 = *(ushort *)pPVar6 & 0xff00 | (ushort)iVar4 & 0xff;
    memcpy(pPVar6->list_,head->list_ + iVar5,(long)iVar4 << 3);
    memset(head->list_ + iVar5,0xf0,(long)iVar4 << 3);
    return;
  }
  __assert_fail("alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                ,0x1c,"void raviX_ptrlist_split_node(PtrList *)");
}

Assistant:

void raviX_ptrlist_split_node(PtrList *head)
{
	int old = head->nr_, nr = old / 2;
	C_MemoryAllocator *alloc = head->allocator_;
	assert(alloc);
	PtrList *newlist = (PtrList *)alloc->calloc(alloc->arena, 1, sizeof(PtrList));
	PtrList *next = head->next_;
	newlist->allocator_ = alloc;

	old -= nr;
	head->nr_ = old;
	newlist->next_ = next;
	next->prev_ = newlist;
	newlist->prev_ = head;
	head->next_ = newlist;
	newlist->nr_ = nr;
	memcpy(newlist->list_, head->list_ + old, nr * sizeof(void *));
	memset(head->list_ + old, 0xf0, nr * sizeof(void *));
}